

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenTypeName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  bool bVar1;
  size_t sVar2;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  undefined4 local_50;
  undefined1 local_40 [8];
  string bits;
  Type *type_local;
  LobsterGenerator *this_local;
  
  bits.field_2._8_8_ = type;
  sVar2 = SizeOf(type->base_type);
  NumToString<unsigned_long>((string *)local_40,sVar2 << 3);
  bVar1 = IsInteger(*(BaseType *)bits.field_2._8_8_);
  if (bVar1) {
    bVar1 = IsUnsigned(*(BaseType *)bits.field_2._8_8_);
    if (bVar1) {
      std::operator+(__return_storage_ptr__,"uint",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      std::operator+(__return_storage_ptr__,"int",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
  }
  else {
    bVar1 = IsFloat(*(BaseType *)bits.field_2._8_8_);
    if (bVar1) {
      std::operator+(__return_storage_ptr__,"float",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      bVar1 = IsString((Type *)bits.field_2._8_8_);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"string",&local_51);
        std::allocator<char>::~allocator(&local_51);
      }
      else if (*(int *)bits.field_2._8_8_ == 0xf) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"table",&local_52);
        std::allocator<char>::~allocator(&local_52);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"none",&local_53);
        std::allocator<char>::~allocator(&local_53);
      }
    }
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName(const Type &type) {
    auto bits = NumToString(SizeOf(type.base_type) * 8);
    if (IsInteger(type.base_type)) {
      if (IsUnsigned(type.base_type))
        return "uint" + bits;
      else
        return "int" + bits;
    }
    if (IsFloat(type.base_type)) return "float" + bits;
    if (IsString(type)) return "string";
    if (type.base_type == BASE_TYPE_STRUCT) return "table";
    return "none";
  }